

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::simple_print(ls_solver *this)

{
  ostream *poVar1;
  void *this_00;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x110));
  poVar1 = std::operator<<(poVar1,'\t');
  this_00 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x118));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ls_solver::simple_print() { cout << '\t' << _best_found_cost << '\t' << _best_cost_time << endl; }